

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O2

IntVect __thiscall amrex::BATransformer::doiHi(BATransformer *this)

{
  IntVect IVar1;
  
  switch(this->m_bat_type) {
  case null:
  case coarsenRatio:
    return (int  [3])ZEXT812(0);
  case indexType:
    IVar1 = BATindexType::doiHi(&(this->m_op).m_indexType);
    return (IntVect)IVar1.vect;
  case indexType_coarsenRatio:
    IVar1 = BATindexType_coarsenRatio::doiHi(&(this->m_op).m_indexType_coarsenRatio);
    return (IntVect)IVar1.vect;
  default:
    return (IntVect)*&(this->m_op).m_bndryReg.m_doihi.vect;
  }
}

Assistant:

IntVect doiHi () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.doiHi();
        case     BATType::indexType:
            return m_op.m_indexType.doiHi();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.doiHi();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.doiHi();
        default:
            return m_op.m_bndryReg.doiHi();
        }
    }